

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

OASIS_FLOAT __thiscall
aggreports::GetLoss(aggreports *this,double next_return_period,double last_return_period,
                   OASIS_FLOAT last_loss,double current_return_period,OASIS_FLOAT current_loss)

{
  float fVar1;
  
  fVar1 = 0.0;
  if ((((current_return_period != 0.0) || (NAN(current_return_period))) &&
      ((current_loss != 0.0 || (NAN(current_loss))))) &&
     ((current_return_period != next_return_period ||
      (fVar1 = current_loss, NAN(current_return_period) || NAN(next_return_period))))) {
    if (next_return_period <= current_return_period) {
      fVar1 = -1.0;
    }
    else {
      fVar1 = (float)((((double)last_loss - (double)current_loss) *
                      (next_return_period - current_return_period)) /
                      (last_return_period - current_return_period) + (double)current_loss);
    }
  }
  return fVar1;
}

Assistant:

OASIS_FLOAT aggreports::GetLoss(const double next_return_period,
				const double last_return_period,
				const OASIS_FLOAT last_loss,
				const double current_return_period,
				const OASIS_FLOAT current_loss) const {

  if (current_return_period == 0.0) return 0.0;

  if (current_loss == 0.0) return 0.0;

  if (current_return_period == next_return_period) return current_loss;

  if (current_return_period < next_return_period) {
    line_points lpt;
    lpt.from_x = last_return_period;
    lpt.from_y = last_loss;
    lpt.to_x = current_return_period;
    lpt.to_y = current_loss;
    double zz = linear_interpolate(lpt, next_return_period);
    return zz;
  }

  return -1;   // should not get here

}